

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_fluent.cpp
# Opt level: O0

FormattedNumber __thiscall
icu_63::number::LocalizedNumberFormatter::formatDouble
          (LocalizedNumberFormatter *this,double value,UErrorCode *status)

{
  UBool UVar1;
  UFormattedNumberData *pUVar2;
  UErrorCode *in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 uVar3;
  UErrorCode *size;
  FormattedNumber FVar4;
  UFormattedNumberData *local_70;
  UFormattedNumberData *results;
  UErrorCode *status_local;
  double value_local;
  LocalizedNumberFormatter *this_local;
  
  size = status;
  UVar1 = ::U_FAILURE(*in_RDX);
  if (UVar1 == '\0') {
    pUVar2 = (UFormattedNumberData *)UMemory::operator_new((UMemory *)0x158,(size_t)size);
    local_70 = (UFormattedNumberData *)0x0;
    if (pUVar2 != (UFormattedNumberData *)0x0) {
      memset(pUVar2,0,0x158);
      impl::UFormattedNumberData::UFormattedNumberData(pUVar2);
      local_70 = pUVar2;
    }
    if (local_70 == (UFormattedNumberData *)0x0) {
      *in_RDX = U_MEMORY_ALLOCATION_ERROR;
      FormattedNumber::FormattedNumber((FormattedNumber *)this,*in_RDX);
      uVar3 = extraout_RDX_00;
    }
    else {
      impl::DecimalQuantity::setToDouble(&local_70->quantity,value);
      pUVar2 = local_70;
      formatImpl((LocalizedNumberFormatter *)status,local_70,in_RDX);
      UVar1 = ::U_SUCCESS(*in_RDX);
      if (UVar1 == '\0') {
        if (local_70 != (UFormattedNumberData *)0x0) {
          impl::UFormattedNumberData::~UFormattedNumberData(local_70);
          UMemory::operator_delete((UMemory *)local_70,pUVar2);
        }
        FormattedNumber::FormattedNumber((FormattedNumber *)this,*in_RDX);
        uVar3 = extraout_RDX_02;
      }
      else {
        FormattedNumber::FormattedNumber((FormattedNumber *)this,local_70);
        uVar3 = extraout_RDX_01;
      }
    }
  }
  else {
    FormattedNumber::FormattedNumber((FormattedNumber *)this,U_ILLEGAL_ARGUMENT_ERROR);
    uVar3 = extraout_RDX;
  }
  FVar4._8_8_ = uVar3;
  FVar4.fResults = (UFormattedNumberData *)this;
  return FVar4;
}

Assistant:

FormattedNumber LocalizedNumberFormatter::formatDouble(double value, UErrorCode& status) const {
    if (U_FAILURE(status)) { return FormattedNumber(U_ILLEGAL_ARGUMENT_ERROR); }
    auto results = new UFormattedNumberData();
    if (results == nullptr) {
        status = U_MEMORY_ALLOCATION_ERROR;
        return FormattedNumber(status);
    }
    results->quantity.setToDouble(value);
    formatImpl(results, status);

    // Do not save the results object if we encountered a failure.
    if (U_SUCCESS(status)) {
        return FormattedNumber(results);
    } else {
        delete results;
        return FormattedNumber(status);
    }
}